

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

size_t anon_unknown.dwarf_99e164::collectPathsForDebug
                 (string *buffer,cmSearchPath *searchPath,size_t startIndex)

{
  size_t sVar1;
  long *plVar2;
  long *plVar3;
  pointer pPVar4;
  long lVar5;
  long *local_70;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((searchPath->Paths).
      super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (searchPath->Paths).
      super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)buffer);
    sVar1 = 0;
  }
  else {
    pPVar4 = (searchPath->Paths).
             super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar1 = (long)(searchPath->Paths).
                  super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 6;
    if (startIndex < sVar1) {
      lVar5 = startIndex << 6;
      do {
        std::operator+(&local_50,"  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(pPVar4->Path)._M_dataplus._M_p + lVar5));
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_60 = *plVar3;
          lStack_58 = plVar2[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar3;
          local_70 = (long *)*plVar2;
        }
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)buffer,(ulong)local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        startIndex = startIndex + 1;
        pPVar4 = (searchPath->Paths).
                 super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar1 = (long)(searchPath->Paths).
                      super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 6;
        lVar5 = lVar5 + 0x40;
      } while (startIndex < sVar1);
    }
  }
  return sVar1;
}

Assistant:

std::size_t collectPathsForDebug(std::string& buffer,
                                 cmSearchPath const& searchPath,
                                 std::size_t const startIndex = 0)
{
  const auto& paths = searchPath.GetPaths();
  if (paths.empty()) {
    buffer += "  none\n";
    return 0;
  }
  for (auto i = startIndex; i < paths.size(); i++) {
    buffer += "  " + paths[i].Path + "\n";
  }
  return paths.size();
}